

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O2

int __thiscall
vk::DescriptorSetUpdateBuilder::copy
          (DescriptorSetUpdateBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  value_type local_40;
  
  local_40.srcBinding = (deUint32)src;
  local_40.sType = VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET;
  local_40.pNext = (void *)0x0;
  local_40.srcSet.m_internal = (deUint64)dst;
  std::vector<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>::push_back
            (&this->m_copies,&local_40);
  return (int)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::copy (VkDescriptorSet	srcSet,
															  deUint32			srcBinding,
															  deUint32			srcArrayElement,
															  VkDescriptorSet	destSet,
															  deUint32			destBinding,
															  deUint32			destArrayElement,
															  deUint32			count)
{
	const VkCopyDescriptorSet copyParams =
	{
		VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET,
		DE_NULL,
		srcSet,				//!< srcSet
		srcBinding,			//!< srcBinding
		srcArrayElement,	//!< srcArrayElement
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
	};
	m_copies.push_back(copyParams);
	return *this;
}